

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetAllocatedMessage
          (ExtensionSet *this,int number,FieldType type,FieldDescriptor *descriptor,
          MessageLite *message)

{
  byte *pbVar1;
  byte bVar2;
  Arena *pAVar3;
  int iVar4;
  undefined4 extraout_var;
  _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
  _Var5;
  LogMessage *pLVar6;
  _Base_ptr p_Var7;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar8;
  LogFinisher local_e1;
  Arena *local_e0;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  undefined4 extraout_var_00;
  
  if (message == (MessageLite *)0x0) {
    ClearExtension(this,number);
    return;
  }
  iVar4 = (*message->_vptr_MessageLite[5])(message);
  local_e0 = (Arena *)CONCAT44(extraout_var,iVar4);
  local_d8.filename_ = (char *)0x0;
  local_d8.line_ = 0;
  local_d8._20_4_ = 0;
  local_d8.message_._M_dataplus._M_p = (pointer)0x0;
  local_d8.level_ = number;
  pVar8 = std::
          _Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
          ::_M_emplace_unique<std::pair<int,google::protobuf::internal::ExtensionSet::Extension>>
                    ((_Rb_tree<int,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>,std::_Select1st<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                      *)this,(pair<int,_google::protobuf::internal::ExtensionSet::Extension> *)
                             &local_d8);
  _Var5 = pVar8.first._M_node;
  _Var5._M_node[1]._M_right = (_Base_ptr)descriptor;
  if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (*(char *)((long)&_Var5._M_node[1]._M_left + 1) != '\0') {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x268);
      pLVar6 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (OPTIONAL): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_d8,pLVar6);
      LogMessage::~LogMessage(&local_a0);
    }
    bVar2 = *(byte *)&_Var5._M_node[1]._M_left;
    if ((byte)(bVar2 - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar6 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar6);
      LogMessage::~LogMessage(&local_d8);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar2 * 4) != 10) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x268);
      pLVar6 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_e1,pLVar6);
      LogMessage::~LogMessage(&local_68);
    }
    pAVar3 = local_e0;
    if (((ulong)_Var5._M_node[1]._M_left & 0x100000) != 0) {
      (**(code **)(*(long *)_Var5._M_node[1]._M_parent + 0x28))(_Var5._M_node[1]._M_parent,message);
      goto LAB_0034ac8f;
    }
    if ((this->arena_ == (Arena *)0x0) && (_Var5._M_node[1]._M_parent != (_Base_ptr)0x0)) {
      (**(code **)(*(long *)_Var5._M_node[1]._M_parent + 8))();
    }
    if (pAVar3 == this->arena_) goto LAB_0034ac7c;
  }
  else {
    *(FieldType *)&_Var5._M_node[1]._M_left = type;
    if ((byte)(type - 0x13) < 0xee) {
      LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x34);
      pLVar6 = LogMessage::operator<<
                         (&local_d8,
                          "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
      LogFinisher::operator=((LogFinisher *)&local_a0,pLVar6);
      LogMessage::~LogMessage(&local_d8);
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 10) {
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x25b);
      pLVar6 = LogMessage::operator<<
                         (&local_a0,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=((LogFinisher *)&local_68,pLVar6);
      LogMessage::~LogMessage(&local_a0);
    }
    *(undefined1 *)((long)&_Var5._M_node[1]._M_left + 1) = 0;
    pbVar1 = (byte *)((long)&_Var5._M_node[1]._M_left + 2);
    *pbVar1 = *pbVar1 & 0xf;
    pAVar3 = local_e0;
    if (local_e0 == this->arena_) {
LAB_0034ac7c:
      _Var5._M_node[1]._M_parent = (_Base_ptr)message;
      goto LAB_0034ac8f;
    }
  }
  if (pAVar3 == (Arena *)0x0) {
    _Var5._M_node[1]._M_parent = (_Base_ptr)message;
    Arena::Own<google::protobuf::MessageLite>(this->arena_,message);
  }
  else {
    iVar4 = (*message->_vptr_MessageLite[4])(message);
    p_Var7 = (_Base_ptr)CONCAT44(extraout_var_00,iVar4);
    _Var5._M_node[1]._M_parent = p_Var7;
    (**(code **)(*(long *)p_Var7 + 0x50))(p_Var7,message);
  }
LAB_0034ac8f:
  pbVar1 = (byte *)((long)&_Var5._M_node[1]._M_left + 2);
  *pbVar1 = *pbVar1 & 0xf0;
  return;
}

Assistant:

void ExtensionSet::SetAllocatedMessage(int number, FieldType type,
                                       const FieldDescriptor* descriptor,
                                       MessageLite* message) {
  if (message == NULL) {
    ClearExtension(number);
    return;
  }
  ::google::protobuf::Arena* message_arena = message->GetArena();
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    if (message_arena == arena_) {
      extension->message_value = message;
    } else if (message_arena == NULL) {
      extension->message_value = message;
      arena_->Own(message);  // not NULL because not equal to message_arena
    } else {
      extension->message_value = message->New(arena_);
      extension->message_value->CheckTypeAndMergeFrom(*message);
    }
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    if (extension->is_lazy) {
      extension->lazymessage_value->SetAllocatedMessage(message);
    } else {
      if (arena_ == NULL) {
        delete extension->message_value;
      }
      if (message_arena == arena_) {
        extension->message_value = message;
      } else if (message_arena == NULL) {
        extension->message_value = message;
        arena_->Own(message);  // not NULL because not equal to message_arena
      } else {
        extension->message_value = message->New(arena_);
        extension->message_value->CheckTypeAndMergeFrom(*message);
      }
    }
  }
  extension->is_cleared = false;
}